

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_set___proto__(JSContext *ctx,JSValue this_val,JSValue proto)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  long lVar1;
  int iVar2;
  JSValueUnion in_RCX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  int64_t in_R8;
  JSValue JVar3;
  BOOL in_stack_00000034;
  JSContext *in_stack_00000038;
  undefined1 in_stack_00000040 [16];
  undefined1 in_stack_00000050 [16];
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar3.tag = in_RDX;
  JVar3.u.ptr = in_RSI.ptr;
  iVar2 = JS_IsUndefined(JVar3);
  if ((iVar2 != 0) ||
     (v_01.tag = in_RDX, v_01.u.ptr = in_RSI.ptr, iVar2 = JS_IsNull(v_01), iVar2 != 0)) {
    JVar3 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x1abe5d);
    return JVar3;
  }
  v.tag = in_R8;
  v.u.ptr = in_RCX.ptr;
  iVar2 = JS_IsObject(v);
  lVar1 = local_10;
  if ((iVar2 == 0) &&
     (v_00.tag = in_R8, v_00.u.ptr = in_RCX.ptr, iVar2 = JS_IsNull(v_00), iVar2 == 0)) {
    local_10.ptr = (void *)(lVar1 << 0x20);
    local_8 = 3;
    return _local_10;
  }
  iVar2 = JS_SetPrototypeInternal
                    (in_stack_00000038,(JSValue)in_stack_00000050,(JSValue)in_stack_00000040,
                     in_stack_00000034);
  if (iVar2 < 0) {
    local_10.ptr = (void *)(lVar1 << 0x20);
    local_8 = 6;
    return _local_10;
  }
  local_10.ptr = (void *)(lVar1 << 0x20);
  local_8 = 3;
  return _local_10;
}

Assistant:

static JSValue js_object_set___proto__(JSContext *ctx, JSValueConst this_val,
                                       JSValueConst proto)
{
    if (JS_IsUndefined(this_val) || JS_IsNull(this_val))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    if (!JS_IsObject(proto) && !JS_IsNull(proto))
        return JS_UNDEFINED;
    if (JS_SetPrototypeInternal(ctx, this_val, proto, TRUE) < 0)
        return JS_EXCEPTION;
    else
        return JS_UNDEFINED;
}